

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O3

void __thiscall fat::create_new_file(fat *this,string *file_path,string *fat_path)

{
  pointer *ppdVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  int32_t *__src;
  char *pcVar5;
  undefined8 uVar6;
  pointer piVar7;
  fat *pfVar8;
  int32_t iVar9;
  FILE *pFVar10;
  undefined1 *puVar11;
  pointer pbVar12;
  long *plVar13;
  boot_record *pbVar14;
  pointer pbVar15;
  size_type *psVar16;
  string *psVar17;
  long lVar18;
  short sVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  undefined8 __s1;
  char *__dest;
  short sVar24;
  ulong uVar25;
  undefined8 uStack_1a0;
  undefined1 auStack_198 [16];
  directory root;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  undefined1 *local_128;
  string extension;
  string content;
  string cropped_file_name;
  string file_name;
  vector<fat::directory,_std::allocator<fat::directory>_> children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 *local_68;
  string *local_60;
  vector<int,_std::allocator<int>_> local_58;
  fat *local_38;
  
  __dest = auStack_198;
  puVar11 = auStack_198;
  extension.field_2._M_local_buf[8] = 0x2f;
  uStack_1a0 = 0x105380;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&name.field_2 + 8),(fat *)file_path,fat_path,extension.field_2._M_local_buf + 8)
  ;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  uStack_1a0 = 0x1053a4;
  pFVar10 = fopen((file_path->_M_dataplus)._M_p,"r");
  if (pFVar10 == (FILE *)0x0) {
    uStack_1a0 = 0x105cd6;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FILE NOT FOUND",0xe);
    uStack_1a0 = 0x105ce2;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    uStack_1a0 = 0x1053bf;
    fseek(pFVar10,0,2);
    uStack_1a0 = 0x1053c7;
    puVar11 = (undefined1 *)ftell(pFVar10);
    uStack_1a0 = 0x1053d6;
    fseek(pFVar10,0,0);
    extension.field_2._8_8_ = &content._M_string_length;
    uStack_1a0 = 0x1053f2;
    std::__cxx11::string::_M_construct((ulong)((long)&extension.field_2 + 8),(char)puVar11);
    uStack_1a0 = 0x10540d;
    local_68 = puVar11;
    fread((void *)extension.field_2._8_8_,(size_t)puVar11,1,pFVar10);
    uStack_1a0 = 0x105415;
    fclose(pFVar10);
    uVar21 = (ulong)this->fs_br->cluster_size;
    iVar20 = 0;
    iVar23 = (int)((ulong)content._M_dataplus._M_p / uVar21);
    local_38 = this;
    if (0 < iVar23) {
      local_60 = file_path;
      do {
        uStack_1a0 = 0x105476;
        std::__cxx11::string::substr
                  ((ulong)(&cropped_file_name.field_2._M_allocated_capacity + 1),
                   (ulong)((long)&extension.field_2 + 8));
        uStack_1a0 = 0x105481;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (&cropped_file_name.field_2._M_allocated_capacity + 1));
        if ((size_type *)CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_)
            != &file_name._M_string_length) {
          uStack_1a0 = 0x105499;
          operator_delete((undefined1 *)
                          CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_)
                         );
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < iVar23);
      uVar21 = (ulong)local_38->fs_br->cluster_size;
      file_path = local_60;
    }
    if ((ulong)content._M_dataplus._M_p % uVar21 != 0) {
      uStack_1a0 = 0x1054e9;
      std::__cxx11::string::substr
                ((ulong)((long)&cropped_file_name.field_2 + 8),(ulong)((long)&extension.field_2 + 8)
                );
      uStack_1a0 = 0x1054f9;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cropped_file_name.field_2 + 8));
      if ((size_type *)CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_) !=
          &file_name._M_string_length) {
        uStack_1a0 = 0x10550e;
        operator_delete((undefined1 *)
                        CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_));
      }
    }
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar21 = 0;
    }
    else {
      uVar25 = 0;
      pbVar12 = local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 = local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        lVar22 = (long)local_38->fs_br->usable_cluster_count;
        lVar18 = 0;
        if (0 < lVar22) {
          lVar18 = 0;
          do {
            if (local_38->fat_table[lVar18] == local_38->FAT_UNUSED) {
              local_38->fat_table[lVar18] = local_38->FAT_FILE_END;
              goto LAB_00105573;
            }
            lVar18 = lVar18 + 1;
          } while (lVar22 != lVar18);
          lVar18 = 0;
        }
LAB_00105573:
        cropped_file_name.field_2._8_4_ = (undefined4)lVar18;
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          uStack_1a0 = 0x10559a;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (int *)(cropped_file_name.field_2._M_local_buf + 8));
          pbVar12 = local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar15 = local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = cropped_file_name.field_2._8_4_;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar25 = uVar25 + 1;
        uVar21 = (long)pbVar15 - (long)pbVar12 >> 5;
      } while (uVar25 < uVar21);
    }
    if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2 != uVar21) {
      uStack_1a0 = 0x105d03;
      __assert_fail("free_clusters.size() == split_content.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/honzaseda[P]ZOS/fat.cpp"
                    ,0x7a,"void fat::create_new_file(std::string, std::string)");
    }
    uStack_1a0 = 0x1055ee;
    std::__cxx11::string::find_last_of((char *)file_path,0x10a1c9,0xffffffffffffffff);
    uStack_1a0 = 0x105608;
    std::__cxx11::string::substr((ulong)((long)&cropped_file_name.field_2 + 8),(ulong)file_path);
    pfVar8 = local_38;
    pcVar5 = cropped_file_name.field_2._M_local_buf + 8;
    uStack_1a0 = 0x10562e;
    std::__cxx11::string::find_last_of(pcVar5,0x10a04c,0xffffffffffffffff);
    uStack_1a0 = 0x105642;
    std::__cxx11::string::substr((ulong)&local_128,(ulong)pcVar5);
    uStack_1a0 = 0x10565c;
    std::__cxx11::string::substr((ulong)&root.size,(ulong)&local_128);
    if ((size_type *)local_128 != &extension._M_string_length) {
      uStack_1a0 = 0x105671;
      operator_delete(local_128);
    }
    uStack_1a0 = 0x10568c;
    std::__cxx11::string::find_last_of(pcVar5,0x10a04c,0xffffffffffffffff);
    uStack_1a0 = 0x1056a6;
    std::__cxx11::string::substr((ulong)((long)&content.field_2 + 8),(ulong)pcVar5);
    uStack_1a0 = 0x1056c0;
    std::__cxx11::string::substr((ulong)&local_128,(ulong)((long)&content.field_2 + 8));
    if ((size_type *)content.field_2._8_8_ != &cropped_file_name._M_string_length) {
      uStack_1a0 = 0x1056d5;
      operator_delete((void *)content.field_2._8_8_);
    }
    ppdVar1 = &children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uStack_1a0 = 0x1056fd;
    file_name.field_2._8_8_ = ppdVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&file_name.field_2 + 8),root._16_8_,
               name._M_dataplus._M_p + root._16_8_);
    uStack_1a0 = 0x105710;
    std::__cxx11::string::append(file_name.field_2._M_local_buf + 8);
    uStack_1a0 = 0x10572a;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (file_name.field_2._M_local_buf + 8,(ulong)local_128);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      cropped_file_name._M_string_length = *psVar16;
      cropped_file_name.field_2._M_allocated_capacity = plVar13[3];
      content.field_2._8_8_ = &cropped_file_name._M_string_length;
    }
    else {
      cropped_file_name._M_string_length = *psVar16;
      content.field_2._8_8_ = (size_type *)*plVar13;
    }
    cropped_file_name._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((pointer *)file_name.field_2._8_8_ != ppdVar1) {
      uStack_1a0 = 0x105785;
      operator_delete((void *)file_name.field_2._8_8_);
    }
    auStack_198._8_5_ = 0;
    auStack_198._13_3_ = 0;
    root.name[0] = '\0';
    root.name[1] = '\0';
    root.name[2] = '\0';
    root.name[3] = '\0';
    root.name[4] = '\0';
    root.name[5] = '\x01';
    uStack_1a0 = 0x1057a9;
    strcpy(auStack_198 + 8,(char *)content.field_2._8_8_);
    root.name._8_4_ = SUB84(local_68,0);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uStack_1a0 = 0x105d15;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      root._12_4_ = *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uStack_1a0 = 0x1057da;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&result.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&name.field_2 + 8));
      uStack_1a0 = 0x1057e9;
      iVar9 = get_parent_cluster(pfVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&result.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uStack_1a0 = 0x1057f8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&result.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (-1 < iVar9) {
        uStack_1a0 = 0x105813;
        get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)
                         ((long)&file_name.field_2 + 8),pfVar8,iVar9);
        uVar6 = content.field_2._8_8_;
        local_68 = (undefined1 *)CONCAT44(local_68._4_4_,iVar9);
        pbVar14 = pfVar8->fs_br;
        psVar17 = (string *)(long)pbVar14->cluster_size;
        uVar21 = ((long)children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                        ._M_impl.super__Vector_impl_data._M_start - file_name.field_2._8_8_ >> 3) *
                 -0x5555555555555555;
        if (uVar21 < (ulong)psVar17 / 0x18) {
          local_60 = psVar17;
          if (children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)file_name.field_2._8_8_) {
            lVar18 = uVar21 + (uVar21 == 0);
            __s1 = file_name.field_2._8_8_;
            do {
              uStack_1a0 = 0x10587f;
              iVar20 = strcmp((char *)__s1,(char *)uVar6);
              if ((iVar20 == 0) && (*(char *)(__s1 + 0xd) == '\x01')) goto LAB_00105c90;
              __s1 = __s1 + 0x18;
              lVar18 = lVar18 + -1;
            } while (lVar18 != 0);
          }
          pfVar8 = local_38;
          uStack_1a0 = 0x1058cf;
          fseek((FILE *)local_38->fs,
                (long)(int)local_68 * (long)local_60 +
                (long)pbVar14->usable_cluster_count * (long)pbVar14->fat_copies * 4 + 0x110,0);
          if (children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)file_name.field_2._8_8_) {
            sVar19 = 0x18;
          }
          else {
            lVar18 = 0;
            uVar21 = 0;
            do {
              uStack_1a0 = 0x1058fb;
              fwrite((void *)(file_name.field_2._8_8_ + lVar18),0x18,1,(FILE *)pfVar8->fs);
              uVar21 = uVar21 + 1;
              uVar25 = ((long)children.
                              super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                              _M_impl.super__Vector_impl_data._M_start - file_name.field_2._8_8_ >>
                       3) * -0x5555555555555555;
              lVar18 = lVar18 + 0x18;
            } while (uVar21 <= uVar25 && uVar25 - uVar21 != 0);
            sVar19 = (short)lVar18 + 0x18;
          }
          uStack_1a0 = 0x105944;
          fwrite(auStack_198 + 8,0x18,1,(FILE *)pfVar8->fs);
          pbVar14 = pfVar8->fs_br;
          if (sVar19 < pbVar14->cluster_size) {
            sVar24 = 1;
            do {
              uStack_1a0 = 0x105966;
              fputc(0,(FILE *)pfVar8->fs);
              iVar20 = (int)sVar24;
              pbVar14 = pfVar8->fs_br;
              sVar24 = sVar24 + 1;
            } while (iVar20 < (int)pbVar14->cluster_size - (int)sVar19);
          }
          uVar4 = pbVar14->usable_cluster_count;
          lVar18 = -((ulong)uVar4 * 4 + 0xf & 0xfffffffffffffff0);
          __dest = auStack_198 + lVar18;
          lVar22 = (long)pfVar8->fs_br->usable_cluster_count;
          if (0 < lVar22) {
            __src = pfVar8->fat_table;
            *(undefined8 *)(auStack_198 + lVar18 + -8) = 0x1059c0;
            memcpy(__dest,__src,lVar22 << 2);
          }
          piVar7 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar21 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            iVar9 = pfVar8->FAT_FILE_END;
            lVar22 = 0;
            do {
              if (uVar21 - 1 == lVar22) {
                *(int32_t *)(__dest + (long)piVar7[uVar21 - 1] * 4) = iVar9;
              }
              else {
                if (uVar21 <= lVar22 + 1U) goto LAB_00105c82;
                *(int *)(__dest + (long)piVar7[lVar22] * 4) = piVar7[lVar22 + 1];
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != uVar21 + (uVar21 == 0));
          }
          pFVar10 = (FILE *)pfVar8->fs;
          iVar20 = 0;
          local_60 = (string *)auStack_198;
          *(undefined8 *)(auStack_198 + lVar18 + -8) = 0x105a37;
          fseek(pFVar10,0x110,0);
          if ('\0' < pfVar8->fs_br->fat_copies) {
            do {
              pFVar10 = (FILE *)pfVar8->fs;
              *(undefined8 *)(auStack_198 + lVar18 + -8) = 0x105a5e;
              fwrite(__dest,(ulong)uVar4 << 2,1,pFVar10);
              iVar20 = iVar20 + 1;
            } while (iVar20 < pfVar8->fs_br->fat_copies);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start) {
            lVar18 = 0;
            uVar21 = 0;
            puVar11 = __dest;
            do {
              uVar3 = pfVar8->fs_br->cluster_size;
              lVar22 = -(ulong)(uVar3 + 0xf & 0xfffffff0);
              __dest = puVar11 + lVar22;
              local_68 = puVar11;
              __dest[-8] = -0x4a;
              __dest[-7] = 'Z';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              memset(__dest,0,(ulong)uVar3);
              if ((ulong)((long)local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar21) {
LAB_00105c71:
                __dest[-8] = -0x7e;
                __dest[-7] = '\\';
                __dest[-6] = '\x10';
                __dest[-5] = '\0';
                __dest[-4] = '\0';
                __dest[-3] = '\0';
                __dest[-2] = '\0';
                __dest[-1] = '\0';
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar21);
LAB_00105c82:
                __dest[-8] = -0x70;
                __dest[-7] = '\\';
                __dest[-6] = '\x10';
                __dest[-5] = '\0';
                __dest[-4] = '\0';
                __dest[-3] = '\0';
                __dest[-2] = '\0';
                __dest[-1] = '\0';
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
LAB_00105c90:
                *(undefined8 *)(__dest + -8) = 0x105ca8;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"NAME ALREADY EXISTS",0x13);
                *(undefined8 *)(__dest + -8) = 0x105cb4;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                puVar11 = __dest;
                goto LAB_00105cb4;
              }
              pcVar5 = *(char **)((long)&((local_88.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar18);
              __dest[-8] = -0x26;
              __dest[-7] = 'Z';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              strcpy(__dest,pcVar5);
              pFVar10 = (FILE *)pfVar8->fs;
              cVar2 = pfVar8->fs_br->fat_copies;
              iVar20 = pfVar8->fs_br->usable_cluster_count;
              builtin_strncpy(puVar11 + lVar22 + -8,"\x04[\x10",4);
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              fseek(pFVar10,(long)iVar20 * (long)cVar2 * 4 + 0x110,0);
              if ((ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) <= uVar21) goto LAB_00105c71;
              pFVar10 = (FILE *)pfVar8->fs;
              sVar19 = pfVar8->fs_br->cluster_size;
              iVar20 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21];
              builtin_strncpy(puVar11 + lVar22 + -8,">[\x10",4);
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              fseek(pFVar10,(long)iVar20 * (long)sVar19,1);
              pFVar10 = (FILE *)pfVar8->fs;
              builtin_strncpy(puVar11 + lVar22 + -8,"R[\x10",4);
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              fwrite(__dest,(ulong)uVar3,1,pFVar10);
              uVar21 = uVar21 + 1;
              lVar18 = lVar18 + 0x20;
              __dest = local_68;
              puVar11 = local_68;
            } while (uVar21 < (ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 2));
          }
          *(undefined8 *)(__dest + -8) = 0x105b8d;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
          uVar6 = *(undefined8 *)(std::cout + -0x18);
          *(undefined8 *)(__dest + -8) = 0x105ba1;
          std::ios::widen((char)uVar6 + '0');
          *(undefined8 *)(__dest + -8) = 0x105bb0;
          std::ostream::put('0');
          *(undefined8 *)(__dest + -8) = 0x105bb8;
          std::ostream::flush();
          psVar17 = local_60;
          uVar6 = file_name.field_2._8_8_;
          if (file_name.field_2._8_8_ != 0) {
            *(undefined8 *)((long)&local_60[-1].field_2 + 8) = 0x105bdb;
            operator_delete((void *)uVar6);
          }
          uVar6 = content.field_2._8_8_;
          if ((size_type *)content.field_2._8_8_ != &cropped_file_name._M_string_length) {
            *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105bec;
            operator_delete((void *)uVar6);
          }
          if ((size_type *)local_128 != &extension._M_string_length) {
            *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105bfd;
            operator_delete(local_128);
          }
          if ((size_type *)root._16_8_ != &name._M_string_length) {
            *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105c12;
            operator_delete((void *)root._16_8_);
          }
          puVar11 = (undefined1 *)
                    CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_);
          if ((size_type *)puVar11 != &file_name._M_string_length) {
            *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105c27;
            operator_delete(puVar11);
          }
          uVar6 = extension.field_2._8_8_;
          if ((size_type *)extension.field_2._8_8_ != &content._M_string_length) {
            *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105c3f;
            operator_delete((void *)uVar6);
          }
          piVar7 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (int *)0x0) {
            *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105c4d;
            operator_delete(piVar7);
          }
          *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105c56;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
          *(undefined8 *)((long)&psVar17[-1].field_2 + 8) = 0x105c62;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&name.field_2 + 8));
          return;
        }
        uStack_1a0 = 0x105d56;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DIRECTORY IS FULL",0x11);
        uStack_1a0 = 0x105d62;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        puVar11 = auStack_198;
        goto LAB_00105cb4;
      }
    }
    uStack_1a0 = 0x105d2d;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PATH NOT FOUND",0xe);
    uStack_1a0 = 0x105d39;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    puVar11 = auStack_198;
  }
LAB_00105cb4:
  *(undefined8 *)(puVar11 + -8) = 0x105cbe;
  exit(1);
}

Assistant:

void fat::create_new_file(std::string file_path, std::string fat_path) {
    FILE *fnew;
    std::vector<std::string> result = explode(fat_path, '/');

    struct directory root;
    std::vector<std::string> split_content = std::vector<std::string>();
    std::vector<int32_t> free_clusters = std::vector<int32_t>();

    // ---
    // Reading the input file and storing its content into a string vector
    // ---
    if((fnew = fopen(file_path.c_str(), "r")) == NULL){
        std::cout << "FILE NOT FOUND" << std::endl;
        exit(1);
    }
    fseek(fnew, 0, SEEK_END);
    long fsize = ftell(fnew);
    fseek(fnew, 0, SEEK_SET);
    std::string content(fsize, '\0');
    fread(&content[0], fsize, 1, fnew);
    fclose(fnew);
    int NumSubstrings = content.length() / fs_br->cluster_size;
    for (auto i = 0; i < NumSubstrings; i++) {
        split_content.push_back(content.substr(i * fs_br->cluster_size, fs_br->cluster_size));
    }
    if (content.length() % fs_br->cluster_size != 0) {
        split_content.push_back(content.substr(fs_br->cluster_size * NumSubstrings));
    }

    for (int i = 0; i < split_content.size(); i++) {
        free_clusters.push_back(get_first_free_cluster());
    }
    assert(free_clusters.size() == split_content.size());

    // ---
    // Updating the parent directory content
    // ---
    std::string file_name = file_path.substr(file_path.find_last_of("/") + 1);
    std::string name = file_name.substr(0, file_name.find_last_of(".")).substr(0,8);
    std::string extension = file_name.substr(file_name.find_last_of(".") + 1).substr(0,3);
    std::string cropped_file_name = name + "." + extension;

    memset(root.name, '\0', sizeof(root.name));
    root.is_file = 1;
    strcpy(root.name, cropped_file_name.c_str());
    root.size = fsize;
    root.start_cluster = free_clusters.at(0);

    int32_t parent = get_parent_cluster(result);
    if (parent < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }
    std::vector<fat::directory> children = get_dir_children(parent);
    long max_cluster_dirs = fs_br->cluster_size / sizeof(struct directory);
    if(children.size() >= max_cluster_dirs){
        std::cout << "DIRECTORY IS FULL" << std::endl;
        exit(1);
    }
    for(int i = 0; i < children.size(); i++){
        if((strcmp(children.at(i).name, cropped_file_name.c_str()) == 0) && children.at(i).is_file){
            std::cout << "NAME ALREADY EXISTS" << std::endl;
            exit(1);
        }
    }
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < children.size(); j++) {
        fwrite(&children.at(j), sizeof(directory), 1, fs);
        ac_size += sizeof(directory);
    }
    fwrite(&root, sizeof(root), 1, fs);
    ac_size += sizeof(directory);
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    for (int x = 0; x < free_clusters.size(); x++) {
        if (x != free_clusters.size() - 1) {
            new_fat[free_clusters.at(x)] = free_clusters.at(x + 1);
        } else {
            new_fat[free_clusters.at(x)] = FAT_FILE_END;
        }
    }
    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Inserting the input file content into FAT clusters
    // ---
    for (int i = 0; i < free_clusters.size(); i++) {
        char cluster[fs_br->cluster_size];
        memset(cluster, '\0', sizeof(cluster));
        strcpy(cluster, split_content.at(i).c_str());

        fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count)),
              SEEK_SET);
        fseek(fs, fs_br->cluster_size * free_clusters.at(i), SEEK_CUR);
        fwrite(&cluster, sizeof(cluster), 1, fs);
    }
    std::cout << "OK" << std::endl;
}